

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::EnumValueDescriptorProto::SerializeWithCachedSizesToArray
          (EnumValueDescriptorProto *this,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  uint32 value;
  uint8 *puVar4;
  EnumValueOptions *this_00;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    psVar2 = this->name_;
    *target = '\n';
    value = (uint32)psVar2->_M_string_length;
    if (value < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar4 = target + 2;
    }
    else {
      puVar4 = io::CodedOutputStream::WriteVarint32FallbackToArray(value,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar4);
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    uVar1 = this->number_;
    *target = '\x10';
    if ((long)(int)uVar1 < 0) {
      target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar1,target + 1);
    }
    else if (uVar1 < 0x80) {
      target[1] = (uint8)uVar1;
      target = target + 2;
    }
    else {
      target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
    }
  }
  if ((this->_has_bits_[0] & 4) != 0) {
    this_00 = this->options_;
    if (this_00 == (EnumValueOptions *)0x0) {
      this_00 = *(EnumValueOptions **)(default_instance_ + 0x18);
    }
    *target = '\x1a';
    uVar1 = this_00->_cached_size_;
    if (uVar1 < 0x80) {
      target[1] = (uint8)uVar1;
      puVar4 = target + 2;
    }
    else {
      puVar4 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
    }
    target = EnumValueOptions::SerializeWithCachedSizesToArray(this_00,puVar4);
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* EnumValueDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional int32 number = 2;
  if (has_number()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->number(), target);
  }

  // optional .google.protobuf.EnumValueOptions options = 3;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        3, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}